

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailsOnNotEqual::~TestCheckCloseFailsOnNotEqual
          (TestCheckCloseFailsOnNotEqual *this)

{
  TestCheckCloseFailsOnNotEqual *this_local;
  
  ~TestCheckCloseFailsOnNotEqual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckCloseFailsOnNotEqual)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE (1.0f, 1.1f, 0.01f);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}